

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QSize>::erase(QMovableArrayOps<QSize> *this,QSize *b,qsizetype n)

{
  QSize *__src;
  QSize *pQVar1;
  QSize *pQVar2;
  long lVar3;
  
  __src = b + n;
  pQVar2 = (this->super_QGenericArrayOps<QSize>).super_QArrayDataPointer<QSize>.ptr;
  lVar3 = (this->super_QGenericArrayOps<QSize>).super_QArrayDataPointer<QSize>.size;
  pQVar1 = pQVar2 + lVar3;
  if (__src == pQVar1 || pQVar2 != b) {
    if (__src != pQVar1) {
      memmove(b,__src,(long)pQVar1 - (long)__src);
      lVar3 = (this->super_QGenericArrayOps<QSize>).super_QArrayDataPointer<QSize>.size;
    }
  }
  else {
    (this->super_QGenericArrayOps<QSize>).super_QArrayDataPointer<QSize>.ptr = __src;
  }
  (this->super_QGenericArrayOps<QSize>).super_QArrayDataPointer<QSize>.size = lVar3 - n;
  return;
}

Assistant:

void erase(T *b, qsizetype n)
    {
        T *e = b + n;

        Q_ASSERT(this->isMutable());
        Q_ASSERT(b < e);
        Q_ASSERT(b >= this->begin() && b < this->end());
        Q_ASSERT(e > this->begin() && e <= this->end());

        // Comply with std::vector::erase(): erased elements and all after them
        // are invalidated. However, erasing from the beginning effectively
        // means that all iterators are invalidated. We can use this freedom to
        // erase by moving towards the end.

        std::destroy(b, e);
        if (b == this->begin() && e != this->end()) {
            this->ptr = e;
        } else if (e != this->end()) {
            memmove(static_cast<void *>(b), static_cast<const void *>(e), (static_cast<const T *>(this->end()) - e)*sizeof(T));
        }
        this->size -= n;
    }